

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChNodeSPH::ChNodeSPH(ChNodeSPH *this,ChNodeSPH *other)

{
  ChCollisionModel *pCVar1;
  double dVar2;
  ChCollisionModelBullet *this_00;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x108);
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChNodeXYZ::ChNodeXYZ
            (&this->super_ChNodeXYZ,&PTR_construction_vtable_128__0115b3f8,&other->super_ChNodeXYZ);
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x108 = 0x115b338;
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)0x115b068;
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x50 = 0x115b1b8;
  *(undefined8 *)&this->field_0x68 = 0x115b260;
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->UserForce).m_data[2] = 0.0;
  (this->UserForce).m_data[0] = 0.0;
  (this->UserForce).m_data[1] = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])
            (this_00,&(this->super_ChNodeXYZ).field_0x50);
  pCVar1 = this->collision_model;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_58,
             &(other->container->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  (*pCVar1->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar1,&_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  this->container = other->container;
  if (other != this) {
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
  }
  SetKernelRadius(this,other->h_rad);
  SetCollisionRadius(this,other->coll_rad);
  (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
  (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
  dVar2 = other->density;
  this->volume = other->volume;
  this->density = dVar2;
  this->pressure = other->pressure;
  ChVariablesNode::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChNodeSPH::ChNodeSPH(const ChNodeSPH& other) : ChNodeXYZ(other) {
    collision_model = new ChCollisionModelBullet;
    collision_model->SetContactable(this);
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);
    container = other.container;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;
    pressure = other.pressure;

    variables = other.variables;
}